

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O0

void __thiscall QNetworkAccessCache::timerEvent(QNetworkAccessCache *this,QTimerEvent *param_2)

{
  undefined8 uVar1;
  long in_RDI;
  Node *next;
  QNetworkAccessCache *in_stack_ffffffffffffffd0;
  undefined1 local_21;
  
  while( true ) {
    local_21 = 0;
    if (*(long *)(in_RDI + 0x18) != 0) {
      local_21 = QDeadlineTimer::hasExpired();
    }
    if ((local_21 & 1) == 0) break;
    uVar1 = *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x30);
    (**(code **)(**(long **)(*(long *)(in_RDI + 0x18) + 0x38) + 0x10))();
    QHash<QByteArray,_QNetworkAccessCache::Node_*>::remove
              ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(in_RDI + 0x10),
               (char *)(*(long *)(in_RDI + 0x18) + 0x10));
    in_stack_ffffffffffffffd0 = *(QNetworkAccessCache **)(in_RDI + 0x18);
    if (in_stack_ffffffffffffffd0 != (QNetworkAccessCache *)0x0) {
      Node::~Node((Node *)0x1934c1);
      operator_delete(in_stack_ffffffffffffffd0,0x48);
    }
    *(undefined8 *)(in_RDI + 0x18) = uVar1;
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  else {
    *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28) = 0;
  }
  updateTimer(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void QNetworkAccessCache::timerEvent(QTimerEvent *)
{
    while (firstExpiringNode && firstExpiringNode->timer.hasExpired()) {
        Node *next = firstExpiringNode->next;
        firstExpiringNode->object->dispose();
        hash.remove(firstExpiringNode->key); // `firstExpiringNode` gets deleted
        delete firstExpiringNode;
        firstExpiringNode = next;
    }

    // fixup the list
    if (firstExpiringNode)
        firstExpiringNode->previous = nullptr;
    else
        lastExpiringNode = nullptr;

    updateTimer();
}